

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Layer::Layer(Layer *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_prim_specs)._M_h._M_buckets = &(this->_prim_specs)._M_h._M_single_bucket;
  (this->_prim_specs)._M_h._M_bucket_count = 1;
  (this->_prim_specs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_prim_specs)._M_h._M_element_count = 0;
  (this->_prim_specs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_prim_specs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_prim_specs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LayerMetas::LayerMetas(&this->_metas);
  p_Var1 = &(this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_primspec_path_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_dirty = true;
  this->_has_unresolved_references = true;
  this->_has_unresolved_payload = true;
  this->_has_unresolved_variant = true;
  this->_has_unresolved_inherits = true;
  this->_has_unresolved_specializes = true;
  this->_has_over_primspec = true;
  this->_has_class_primspec = true;
  (this->_current_working_path)._M_dataplus._M_p = (pointer)&(this->_current_working_path).field_2;
  (this->_current_working_path)._M_string_length = 0;
  (this->_current_working_path).field_2._M_local_buf[0] = '\0';
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_asset_resolution_userdata = (void *)0x0;
  return;
}

Assistant:

const std::string name() const { return _name; }